

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magnet_uri.cpp
# Opt level: O0

string * __thiscall
libtorrent::make_magnet_uri_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,torrent_info *info)

{
  bool bVar1;
  info_hash_t *piVar2;
  string *psVar3;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *pvVar4;
  size_type __n;
  reference __args;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *this_00;
  reference __args_00;
  add_torrent_params *atp_00;
  web_seed_entry *s;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *__range1_1;
  announce_entry *tr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
  *__range1;
  undefined1 local_368 [8];
  add_torrent_params atp;
  torrent_info *info_local;
  
  atp.creation_date = (time_t)this;
  add_torrent_params::add_torrent_params((add_torrent_params *)local_368);
  piVar2 = torrent_info::info_hashes((torrent_info *)atp.creation_date);
  atp.info_hashes.v2.m_number._M_elems[5] = (piVar2->v2).m_number._M_elems[7];
  atp.info_hash.m_number._M_elems._12_8_ = *(undefined8 *)(piVar2->v1).m_number._M_elems;
  atp.info_hashes.v1.m_number._M_elems._0_8_ = *(undefined8 *)((piVar2->v1).m_number._M_elems + 2);
  atp.info_hashes.v1.m_number._M_elems._8_8_ = *(undefined8 *)((piVar2->v1).m_number._M_elems + 4);
  atp.info_hashes.v1.m_number._M_elems[4] = (piVar2->v2).m_number._M_elems[1];
  atp.info_hashes.v2.m_number._M_elems[0] = (piVar2->v2).m_number._M_elems[2];
  atp.info_hashes.v2.m_number._M_elems._4_8_ = *(undefined8 *)((piVar2->v2).m_number._M_elems + 3);
  atp.info_hashes.v2.m_number._M_elems._12_8_ = *(undefined8 *)((piVar2->v2).m_number._M_elems + 5);
  psVar3 = torrent_info::name_abi_cxx11_((torrent_info *)atp.creation_date);
  ::std::__cxx11::string::operator=
            ((string *)
             &atp.dht_nodes.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar3);
  pvVar4 = torrent_info::internal_trackers((torrent_info *)atp.creation_date);
  __n = ::std::
        vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ::size(pvVar4);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&atp.ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,__n);
  pvVar4 = torrent_info::internal_trackers((torrent_info *)atp.creation_date);
  __end1 = ::std::
           vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
           ::begin(pvVar4);
  tr = (announce_entry *)
       ::std::
       vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
       end(pvVar4);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
                                *)&tr);
    if (!bVar1) break;
    __args = __gnu_cxx::
             __normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
             ::operator*(&__end1);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &atp.ti.super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&__args->url);
    __gnu_cxx::
    __normal_iterator<const_libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
    ::operator++(&__end1);
  }
  this_00 = torrent_info::internal_web_seeds((torrent_info *)atp.creation_date);
  __end1_1 = ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>
             ::begin(this_00);
  s = (web_seed_entry *)
      ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::end
                (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
                        *)&s);
    if (!bVar1) break;
    __args_00 = __gnu_cxx::
                __normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
                ::operator*(&__end1_1);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &atp.http_seeds.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,&__args_00->url);
    __gnu_cxx::
    __normal_iterator<const_libtorrent::web_seed_entry_*,_std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>_>
    ::operator++(&__end1_1);
  }
  make_magnet_uri_abi_cxx11_(__return_storage_ptr__,(libtorrent *)local_368,atp_00);
  add_torrent_params::~add_torrent_params((add_torrent_params *)local_368);
  return __return_storage_ptr__;
}

Assistant:

std::string make_magnet_uri(torrent_info const& info)
	{
		add_torrent_params atp;
		atp.info_hashes = info.info_hashes();
		atp.name = info.name();
		atp.trackers.reserve(info.internal_trackers().size());
		for (auto const& tr : info.internal_trackers())
			atp.trackers.emplace_back(tr.url);
		for (auto const& s : info.internal_web_seeds())
			atp.url_seeds.emplace_back(s.url);

		return make_magnet_uri(atp);
	}